

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O0

int equal_fare_attributes(fare_attributes_t *a,fare_attributes_t *b)

{
  int iVar1;
  bool local_19;
  fare_attributes_t *b_local;
  fare_attributes_t *a_local;
  
  iVar1 = strcmp(a->fare_id,b->fare_id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->currency_type,b->currency_type);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->agency_id,b->agency_id);
      local_19 = false;
      if (iVar1 == 0) {
        local_19 = false;
        if ((((a->price == b->price) && (!NAN(a->price) && !NAN(b->price))) &&
            (local_19 = false, a->payment_method == b->payment_method)) &&
           (local_19 = false, a->transfers == b->transfers)) {
          local_19 = a->transfer_duration == b->transfer_duration;
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_fare_attributes(const fare_attributes_t *a, const fare_attributes_t *b) {
    return (!strcmp(a->fare_id, b->fare_id) &&
             !strcmp(a->currency_type, b->currency_type) &&
             !strcmp(a->agency_id, b->agency_id) &&
             a->price == b->price &&
             a->payment_method == b->payment_method &&
             a->transfers == b->transfers &&
             a->transfer_duration == b->transfer_duration);
}